

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O2

int __thiscall
vector<server::clientinfo_*>::remove(vector<server::clientinfo_*> *this,char *__filename)

{
  int iVar1;
  clientinfo *pcVar2;
  long lVar3;
  long lVar4;
  
  pcVar2 = this->buf[(int)__filename];
  iVar1 = this->ulen;
  lVar4 = (long)(int)__filename;
  while (lVar3 = lVar4 + 1, lVar3 < iVar1) {
    this->buf[lVar4] = this->buf[lVar3];
    lVar4 = lVar3;
  }
  this->ulen = iVar1 + -1;
  return (int)pcVar2;
}

Assistant:

T remove(int i)
    {
        T e = buf[i];
        for(int p = i+1; p<ulen; p++) buf[p-1] = buf[p];
        ulen--;
        return e;
    }